

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

int disassemble_instruction(Vm *vm,int offset)

{
  byte bVar1;
  uint8_t instruction;
  int offset_local;
  Vm *vm_local;
  
  printf("%04d ",(ulong)(uint)offset);
  bVar1 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).code[offset];
  switch(bVar1) {
  case 0:
    vm_local._4_4_ = simple_instruction("OP_NOP",offset);
    break;
  case 1:
    vm_local._4_4_ = simple_instruction("OP_TRUE",offset);
    break;
  case 2:
    vm_local._4_4_ = simple_instruction("OP_FALSE",offset);
    break;
  case 3:
    vm_local._4_4_ = simple_instruction("OP_NIL",offset);
    break;
  case 4:
    vm_local._4_4_ = simple_instruction("OP_ADD",offset);
    break;
  case 5:
    vm_local._4_4_ = simple_instruction("OP_SUB",offset);
    break;
  case 6:
    vm_local._4_4_ = simple_instruction("OP_MUL",offset);
    break;
  case 7:
    vm_local._4_4_ = simple_instruction("OP_DIV",offset);
    break;
  case 8:
    vm_local._4_4_ = simple_instruction("OP_MOD",offset);
    break;
  case 9:
    vm_local._4_4_ = simple_instruction("OP_POW",offset);
    break;
  case 10:
    vm_local._4_4_ = simple_instruction("OP_AND",offset);
    break;
  case 0xb:
    vm_local._4_4_ = simple_instruction("OP_OR",offset);
    break;
  case 0xc:
    vm_local._4_4_ = simple_instruction("OP_EQUAL",offset);
    break;
  case 0xd:
    vm_local._4_4_ = simple_instruction("OP_NOT_EQUAL",offset);
    break;
  case 0xe:
    vm_local._4_4_ = simple_instruction("OP_GT",offset);
    break;
  case 0xf:
    vm_local._4_4_ = simple_instruction("OP_LT",offset);
    break;
  case 0x10:
    vm_local._4_4_ = simple_instruction("OP_GE",offset);
    break;
  case 0x11:
    vm_local._4_4_ = simple_instruction("OP_LE",offset);
    break;
  case 0x12:
    vm_local._4_4_ = constant_instruction("OP_LDC",vm,offset);
    break;
  case 0x13:
    vm_local._4_4_ = wide_constant_instruction("OP_LDC_W",vm,offset);
    break;
  case 0x14:
    vm_local._4_4_ = simple_instruction("OP_LDC_0",offset);
    break;
  case 0x15:
    vm_local._4_4_ = simple_instruction("OP_LDC_1",offset);
    break;
  case 0x16:
    vm_local._4_4_ = var_instruction("OP_STORE",vm,offset);
    break;
  case 0x17:
    vm_local._4_4_ = var_instruction("OP_LOAD",vm,offset);
    break;
  case 0x18:
    vm_local._4_4_ = double_instruction("OP_LOAD_OFFSET",vm,offset);
    break;
  case 0x19:
    vm_local._4_4_ = double_instruction("OP_STORE_OFFSET",vm,offset);
    break;
  case 0x1a:
    vm_local._4_4_ = simple_instruction("OP_DUP",offset);
    break;
  case 0x1b:
    vm_local._4_4_ = simple_instruction("OP_POP",offset);
    break;
  case 0x1c:
    vm_local._4_4_ = var_instruction("OP_CALL",vm,offset);
    break;
  case 0x1d:
    vm_local._4_4_ = simple_instruction("OP_NEGATE",offset);
    break;
  case 0x1e:
    vm_local._4_4_ = simple_instruction("OP_NOT",offset);
    break;
  case 0x1f:
    vm_local._4_4_ = simple_instruction("OP_PRINT",offset);
    break;
  case 0x20:
    vm_local._4_4_ = simple_instruction("OP_DICT_NEW",offset);
    break;
  case 0x21:
    vm_local._4_4_ = simple_instruction("OP_LIST_NEW",offset);
    break;
  case 0x22:
    vm_local._4_4_ = simple_instruction("OP_LIST_APPEND",offset);
    break;
  case 0x23:
    vm_local._4_4_ = simple_instruction("OP_STRUCT_SET",offset);
    break;
  case 0x24:
    vm_local._4_4_ = simple_instruction("OP_STRUCT_GET",offset);
    break;
  case 0x25:
    vm_local._4_4_ = simple_instruction("OP_STRUCT_PEEK",offset);
    break;
  case 0x26:
    vm_local._4_4_ = jump_instruction("OP_JMP",vm,offset);
    break;
  case 0x27:
    vm_local._4_4_ = jump_instruction("OP_JEQ",vm,offset);
    break;
  case 0x28:
    vm_local._4_4_ = jump_instruction("OP_JMT",vm,offset);
    break;
  case 0x29:
    vm_local._4_4_ = jump_instruction("OP_JMF",vm,offset);
    break;
  case 0x2a:
    vm_local._4_4_ = jump_instruction("OP_JNE",vm,offset);
    break;
  case 0x2b:
    vm_local._4_4_ = jump_instruction("OP_JLT",vm,offset);
    break;
  case 0x2c:
    vm_local._4_4_ = jump_instruction("OP_JLE",vm,offset);
    break;
  case 0x2d:
    vm_local._4_4_ = jump_instruction("OP_JGT",vm,offset);
    break;
  case 0x2e:
    vm_local._4_4_ = jump_instruction("OP_JGE",vm,offset);
    break;
  case 0x2f:
    vm_local._4_4_ = simple_instruction("OP_INC_1",offset);
    break;
  case 0x30:
    vm_local._4_4_ = simple_instruction("OP_DEC_1",offset);
    break;
  case 0x31:
    vm_local._4_4_ = simple_instruction("OP_RETURN",offset);
    break;
  default:
    printf("Unknown instruction %d\n",(ulong)bVar1);
    vm_local._4_4_ = offset + 1;
  }
  return vm_local._4_4_;
}

Assistant:

int disassemble_instruction(Vm *vm, int offset) {
    printf("%04d ", offset);

    uint8_t instruction = CURR_FRAME(vm)->code_buffer.code[offset];
    switch (instruction) {
        case OP_NOP:
            return simple_instruction("OP_NOP", offset);
        case OP_ADD:
            return simple_instruction("OP_ADD", offset);
        case OP_SUB:
            return simple_instruction("OP_SUB", offset);
        case OP_MUL:
            return simple_instruction("OP_MUL", offset);
        case OP_POW:
            return simple_instruction("OP_POW", offset);
        case OP_EQUAL:
            return simple_instruction("OP_EQUAL", offset);
        case OP_NOT_EQUAL:
            return simple_instruction("OP_NOT_EQUAL", offset);
        case OP_GT:
            return simple_instruction("OP_GT", offset);
        case OP_LT:
            return simple_instruction("OP_LT", offset);
        case OP_GE:
            return simple_instruction("OP_GE", offset);
        case OP_LE:
            return simple_instruction("OP_LE", offset);
        case OP_DIV:
            return simple_instruction("OP_DIV", offset);
        case OP_LDC:
            return constant_instruction("OP_LDC", vm, offset);
        case OP_LDC_W:
            return wide_constant_instruction("OP_LDC_W", vm, offset);
        case OP_NEGATE:
            return simple_instruction("OP_NEGATE", offset);
        case OP_STORE:
            return var_instruction("OP_STORE", vm, offset);
        case OP_LOAD:
            return var_instruction("OP_LOAD", vm, offset);
        case OP_LOAD_OFFSET:
            return double_instruction("OP_LOAD_OFFSET", vm, offset);
        case OP_STORE_OFFSET:
            return double_instruction("OP_STORE_OFFSET", vm, offset);
        case OP_DUP:
            return simple_instruction("OP_DUP", offset);
        case OP_POP:
            return simple_instruction("OP_POP", offset);
        case OP_RETURN:
            return simple_instruction("OP_RETURN", offset);
        case OP_JMP:
            return jump_instruction("OP_JMP", vm, offset);
        case OP_JEQ:
            return jump_instruction("OP_JEQ", vm, offset);
        case OP_JMT:
            return jump_instruction("OP_JMT", vm, offset);
        case OP_JMF:
            return jump_instruction("OP_JMF", vm, offset);
        case OP_JNE:
            return jump_instruction("OP_JNE", vm, offset);
        case OP_JLT:
            return jump_instruction("OP_JLT", vm, offset);
        case OP_JLE:
            return jump_instruction("OP_JLE", vm, offset);
        case OP_JGT:
            return jump_instruction("OP_JGT", vm, offset);
        case OP_JGE:
            return jump_instruction("OP_JGE", vm, offset);
        case OP_INC_1:
            return simple_instruction("OP_INC_1", offset);
        case OP_DEC_1:
            return simple_instruction("OP_DEC_1", offset);
        case OP_LDC_0:
            return simple_instruction("OP_LDC_0", offset);
        case OP_LDC_1:
            return simple_instruction("OP_LDC_1", offset);
        case OP_CALL:
            return var_instruction("OP_CALL", vm, offset);
        case OP_MOD:
            return simple_instruction("OP_MOD", offset);
        case OP_TRUE:
            return simple_instruction("OP_TRUE", offset);
        case OP_FALSE:
            return simple_instruction("OP_FALSE", offset);
        case OP_NIL:
            return simple_instruction("OP_NIL", offset);
        case OP_AND:
            return simple_instruction("OP_AND", offset);
        case OP_OR:
            return simple_instruction("OP_OR", offset);
        case OP_NOT:
            return simple_instruction("OP_NOT", offset);
        case OP_PRINT:
            return simple_instruction("OP_PRINT", offset);
        case OP_DICT_NEW:
            return simple_instruction("OP_DICT_NEW", offset);
        case OP_LIST_NEW:
            return simple_instruction("OP_LIST_NEW", offset);
        case OP_LIST_APPEND:
            return simple_instruction("OP_LIST_APPEND", offset);
        case OP_STRUCT_SET:
            return simple_instruction("OP_STRUCT_SET", offset);
        case OP_STRUCT_GET:
            return simple_instruction("OP_STRUCT_GET", offset);
        case OP_STRUCT_PEEK:
            return simple_instruction("OP_STRUCT_PEEK", offset);
        default:
            printf("Unknown instruction %d\n", instruction);
            return offset + 1;
    }
}